

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ConfidentialAssetId *
cfd::core::ConfidentialAssetId::GetCommitment
          (ConfidentialAssetId *__return_storage_ptr__,ConfidentialAssetId *unblind_asset,
          BlindFactor *asset_blind_factor)

{
  CfdException *pCVar1;
  allocator local_91;
  undefined1 local_90 [36];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  vector<unsigned_char,_std::allocator<unsigned_char>_> abf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_id;
  
  if (1 < unblind_asset->version_) {
    local_90._0_8_ = "cfdcore_elements_transaction.cpp";
    local_90._8_4_ = 0x1e0;
    local_90._16_8_ = "GetCommitment";
    logger::warn<>((CfdSourceLocation *)local_90,"asset is commitment.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_90,"asset is commitment.",(allocator *)&generator);
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_90);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&generator,0x21,
             (allocator_type *)local_90);
  GetUnblindedData((ByteData *)local_90,unblind_asset);
  ByteData::GetBytes(&asset_id,(ByteData *)local_90);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,
             &(asset_blind_factor->data_).data_);
  ByteData256::GetBytes(&abf,(ByteData256 *)local_90);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
  ret = wally_asset_generator_from_bytes
                  (asset_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)asset_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)asset_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   abf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)abf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)abf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData::ByteData((ByteData *)local_90,&generator);
    ConfidentialAssetId(__return_storage_ptr__,(ByteData *)local_90);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&abf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&asset_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_90._0_8_ = "cfdcore_elements_transaction.cpp";
  local_90._8_4_ = 0x1ea;
  local_90._16_8_ = "GetCommitment";
  logger::warn<int&>((CfdSourceLocation *)local_90,"wally_asset_generator_from_bytes NG[{}].",&ret);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_90,"calc asset commitment error.",&local_91);
  CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_90);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool ConfidentialAssetId::HasBlinding() const {
  return (version_ != 0) && (version_ != kConfidentialVersion_1);
}